

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O2

void __thiscall
st_tree::detail::
node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
::~node_base(node_base<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>,_std::multiset<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>_>
             *this)

{
  _Base_ptr p_Var1;
  tree_type *this_00;
  pointer ppnVar2;
  vector<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  d;
  node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>
  *local_50;
  _Vector_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  local_48;
  
  this->_vptr_node_base = (_func_int **)&PTR__node_base_002cd2c0;
  if (((this->_children)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (this->_tree != (tree_type *)0x0 || this->_parent != (node_type *)0x0)) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (p_Var1 = (this->_children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->_children)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      local_50 = *(node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>
                   **)(p_Var1 + 1);
      std::
      vector<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>*,std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>*>>
      ::
      emplace_back<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>*>
                ((vector<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>*,std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,st_tree::ordered<st_tree::arg_default>,std::allocator<int>>,int,std::less<int>>*>>
                  *)&local_48,&local_50);
    }
    std::
    _Rb_tree<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::_Identity<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
    ::clear(&(this->_children)._M_t);
    this_00 = tree(this);
    for (ppnVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
        ppnVar2 != local_48._M_impl.super__Vector_impl_data._M_finish; ppnVar2 = ppnVar2 + 1) {
      tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>::_delete_node
                (this_00,*ppnVar2);
    }
    std::
    _Vector_base<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
    ::~_Vector_base(&local_48);
  }
  max_maintainer<unsigned_long,_std::allocator<int>_>::~max_maintainer(&this->_depth);
  std::
  _Rb_tree<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*,_std::_Identity<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>,_st_tree::detail::ptr_less_data<std::less<int>_>,_std::allocator<st_tree::detail::node_ordered<st_tree::tree<int,_st_tree::ordered<st_tree::arg_default>,_std::allocator<int>_>,_int,_std::less<int>_>_*>_>
  ::~_Rb_tree(&(this->_children)._M_t);
  return;
}

Assistant:

virtual ~node_base() {
        // Saves work, and also prevents exception attempting to call tree() on default-constructed nodes
        if (_children.empty() || _default_constructed()) return;
        // Save off child pointers, take down the child container, and then deallocate children
        vector<node_type*> d;
        for (iterator j(begin());  j != end();  ++j)  d.push_back(&*j);
        _children.clear();
        tree_type& tree_ = this->tree();
        for (typename vector<node_type*>::iterator e(d.begin());  e != d.end();  ++e)  tree_._delete_node(*e);
    }